

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator,
          int recursion_budget)

{
  uint uVar1;
  pointer pUVar2;
  bool bVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  string *src;
  _func_int **pp_Var6;
  UnknownFieldSet *unknown_fields_00;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  UnknownField *this_00;
  long lVar7;
  char *pcVar8;
  long lVar9;
  Hex hex;
  Hex hex_00;
  undefined8 uStack_1f0;
  string local_1d8;
  string field_number;
  UnknownFieldSet embedded_unknown_fields;
  StringPiece local_170;
  StringPiece local_160;
  StringPiece local_150;
  StringPiece local_140;
  StringPiece local_130;
  StringPiece local_120;
  StringPiece local_110;
  StringPiece local_100;
  StringPiece local_f0;
  StringPiece local_e0;
  StringPiece local_d0;
  StringPiece local_c0;
  StringPiece local_b0;
  StringPiece local_a0;
  StringPiece local_90;
  CodedInputStream local_80;
  
  lVar7 = 0;
  lVar9 = 0;
  do {
    pUVar2 = (unknown_fields->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(unknown_fields->fields_).
                            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) >> 4) <=
        lVar9) {
      return;
    }
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_80,*(int *)((long)&pUVar2->number_ + lVar7));
    StrCat_abi_cxx11_(&field_number,(protobuf *)&local_80,a);
    uVar1 = *(uint *)((long)&pUVar2->type_ + lVar7);
    if (uVar1 < 5) {
      this_00 = (UnknownField *)((long)&pUVar2->number_ + lVar7);
      switch(uVar1) {
      case 0:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,field_number._M_dataplus._M_p,field_number._M_string_length);
        stringpiece_internal::StringPiece::StringPiece(&local_90,": ");
        TextGenerator::PrintMaybeWithMarker(generator,local_90);
        uVar5 = UnknownField::varint(this_00);
        strings::AlphaNum::AlphaNum((AlphaNum *)&local_80,uVar5);
        StrCat_abi_cxx11_(&local_1d8,(protobuf *)&local_80,a_00);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        break;
      case 1:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,field_number._M_dataplus._M_p,field_number._M_string_length);
        stringpiece_internal::StringPiece::StringPiece(&local_a0,": ");
        stringpiece_internal::StringPiece::StringPiece(&local_b0,"0x");
        TextGenerator::PrintMaybeWithMarker(generator,local_a0,local_b0);
        uVar4 = UnknownField::fixed32(this_00);
        hex_00.value = (ulong)uVar4;
        hex_00._8_8_ = 8;
        strings::AlphaNum::AlphaNum((AlphaNum *)&local_80,hex_00);
        StrCat_abi_cxx11_(&local_1d8,(protobuf *)&local_80,a_02);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        break;
      case 2:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,field_number._M_dataplus._M_p,field_number._M_string_length);
        stringpiece_internal::StringPiece::StringPiece(&local_c0,": ");
        stringpiece_internal::StringPiece::StringPiece(&local_d0,"0x");
        TextGenerator::PrintMaybeWithMarker(generator,local_c0,local_d0);
        uVar5 = UnknownField::fixed64(this_00);
        hex._8_8_ = 0x10;
        hex.value = uVar5;
        strings::AlphaNum::AlphaNum((AlphaNum *)&local_80,hex);
        StrCat_abi_cxx11_(&local_1d8,(protobuf *)&local_80,a_01);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        break;
      case 3:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,field_number._M_dataplus._M_p,field_number._M_string_length);
        src = UnknownField::length_delimited_abi_cxx11_(this_00);
        local_80.buffer_ = (uint8_t *)(src->_M_dataplus)._M_p;
        local_80.total_bytes_read_ = (int)src->_M_string_length;
        local_80.buffer_end_ = local_80.buffer_ + local_80.total_bytes_read_;
        local_80.input_ = (ZeroCopyInputStream *)0x0;
        local_80.legitimate_message_end_ = false;
        local_80.aliasing_enabled_ = false;
        local_80.overflow_bytes_ = 0;
        local_80.last_tag_ = 0;
        local_80.buffer_size_after_limit_ = 0;
        local_80.total_bytes_limit_ = 0x7fffffff;
        local_80.extension_pool_ = (DescriptorPool *)0x0;
        local_80.extension_factory_ = (MessageFactory *)0x0;
        embedded_unknown_fields.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        embedded_unknown_fields.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        embedded_unknown_fields.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.current_limit_ = local_80.total_bytes_read_;
        local_80.recursion_budget_ = recursion_budget;
        local_80.recursion_limit_ = recursion_budget;
        if ((recursion_budget < 1) || (src->_M_string_length == 0)) {
LAB_003aca70:
          stringpiece_internal::StringPiece::StringPiece(&local_120,": ");
          stringpiece_internal::StringPiece::StringPiece(&local_130,"\"");
          TextGenerator::PrintMaybeWithMarker(generator,local_120,local_130);
          CEscape(&local_1d8,src);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                    (generator,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
          std::__cxx11::string::~string((string *)&local_1d8);
          pp_Var6 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
          pcVar8 = "\"\n";
          if (this->single_line_mode_ != false) {
            pcVar8 = "\" ";
          }
        }
        else {
          bVar3 = UnknownFieldSet::ParseFromCodedStream(&embedded_unknown_fields,&local_80);
          if (!bVar3) goto LAB_003aca70;
          if (this->single_line_mode_ == true) {
            stringpiece_internal::StringPiece::StringPiece(&local_e0," ");
            stringpiece_internal::StringPiece::StringPiece(&local_f0,"{ ");
            TextGenerator::PrintMaybeWithMarker(generator,local_e0,local_f0);
          }
          else {
            stringpiece_internal::StringPiece::StringPiece(&local_100," ");
            stringpiece_internal::StringPiece::StringPiece(&local_110,"{\n");
            TextGenerator::PrintMaybeWithMarker(generator,local_100,local_110);
            (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
          }
          PrintUnknownFields(this,&embedded_unknown_fields,generator,recursion_budget + -1);
          pp_Var6 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
          if (this->single_line_mode_ == true) {
            pp_Var6 = pp_Var6 + 5;
            pcVar8 = "} ";
          }
          else {
            (*pp_Var6[3])(generator);
            pp_Var6 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
            pcVar8 = "}\n";
          }
        }
        (**pp_Var6)(generator,pcVar8,2);
        UnknownFieldSet::~UnknownFieldSet(&embedded_unknown_fields);
        io::CodedInputStream::~CodedInputStream(&local_80);
        goto LAB_003acbce;
      case 4:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,field_number._M_dataplus._M_p,field_number._M_string_length);
        if (this->single_line_mode_ == true) {
          stringpiece_internal::StringPiece::StringPiece(&local_140," ");
          stringpiece_internal::StringPiece::StringPiece(&local_150,"{ ");
          TextGenerator::PrintMaybeWithMarker(generator,local_140,local_150);
        }
        else {
          stringpiece_internal::StringPiece::StringPiece(&local_160," ");
          stringpiece_internal::StringPiece::StringPiece(&local_170,"{\n");
          TextGenerator::PrintMaybeWithMarker(generator,local_160,local_170);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        }
        unknown_fields_00 = UnknownField::group(this_00);
        PrintUnknownFields(this,unknown_fields_00,generator,recursion_budget + -1);
        pp_Var6 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
        if (this->single_line_mode_ == true) {
          pcVar8 = "} ";
        }
        else {
          (*pp_Var6[3])(generator);
          pp_Var6 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
          pcVar8 = "}\n";
        }
        uStack_1f0 = 2;
        goto LAB_003acbc8;
      }
      std::__cxx11::string::~string((string *)&local_1d8);
      pp_Var6 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
      pcVar8 = "\n";
      if (this->single_line_mode_ != false) {
        pcVar8 = " ";
      }
      uStack_1f0 = 1;
LAB_003acbc8:
      (*pp_Var6[5])(generator,pcVar8,uStack_1f0);
    }
LAB_003acbce:
    std::__cxx11::string::~string((string *)&field_number);
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + 0x10;
  } while( true );
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator* generator,
    int recursion_budget) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    std::string field_number = StrCat(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator->PrintString(field_number);
        generator->PrintMaybeWithMarker(": ");
        generator->PrintString(StrCat(field.varint()));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator->PrintString(field_number);
        generator->PrintMaybeWithMarker(": ", "0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator->PrintString(field_number);
        generator->PrintMaybeWithMarker(": ", "0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator->PrintString(field_number);
        const std::string& value = field.length_delimited();
        // We create a CodedInputStream so that we can adhere to our recursion
        // budget when we attempt to parse the data. UnknownFieldSet parsing is
        // recursive because of groups.
        io::CodedInputStream input_stream(
            reinterpret_cast<const uint8_t*>(value.data()), value.size());
        input_stream.SetRecursionLimit(recursion_budget);
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && recursion_budget > 0 &&
            embedded_unknown_fields.ParseFromCodedStream(&input_stream)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator->PrintMaybeWithMarker(" ", "{ ");
          } else {
            generator->PrintMaybeWithMarker(" ", "{\n");
            generator->Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator,
                             recursion_budget - 1);
          if (single_line_mode_) {
            generator->PrintLiteral("} ");
          } else {
            generator->Outdent();
            generator->PrintLiteral("}\n");
          }
        } else {
          // This field is not parseable as a Message (or we ran out of
          // recursion budget). So it is probably just a plain string.
          generator->PrintMaybeWithMarker(": ", "\"");
          generator->PrintString(CEscape(value));
          if (single_line_mode_) {
            generator->PrintLiteral("\" ");
          } else {
            generator->PrintLiteral("\"\n");
          }
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator->PrintString(field_number);
        if (single_line_mode_) {
          generator->PrintMaybeWithMarker(" ", "{ ");
        } else {
          generator->PrintMaybeWithMarker(" ", "{\n");
          generator->Indent();
        }
        // For groups, we recurse without checking the budget. This is OK,
        // because if the groups were too deeply nested then we would have
        // already rejected the message when we originally parsed it.
        PrintUnknownFields(field.group(), generator, recursion_budget - 1);
        if (single_line_mode_) {
          generator->PrintLiteral("} ");
        } else {
          generator->Outdent();
          generator->PrintLiteral("}\n");
        }
        break;
    }
  }
}